

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_functional_common.hxx
# Opt level: O0

ptr<snapshot> __thiscall raft_functional_common::TestSm::last_snapshot(TestSm *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<nuraft::snapshot> *in_RSI;
  element_type *in_RDI;
  ptr<snapshot> pVar1;
  lock_guard<std::mutex> ll;
  mutex_type *in_stack_ffffffffffffffc8;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RSI,in_stack_ffffffffffffffc8);
  std::shared_ptr<nuraft::snapshot>::shared_ptr
            (in_RSI,(shared_ptr<nuraft::snapshot> *)in_stack_ffffffffffffffc8);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x203c56);
  pVar1.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<snapshot>)pVar1.super___shared_ptr<nuraft::snapshot,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<snapshot> last_snapshot() {
        std::lock_guard<std::mutex> ll(lastSnapshotLock);
        return lastSnapshot;
    }